

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

size_t jessilib::starts_with_lengthi<char8_t,char32_t>
                 (basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string,
                 basic_string_view<char32_t,_std::char_traits<char32_t>_> in_prefix)

{
  char8_t *pcVar1;
  wchar32 wVar2;
  int iVar3;
  int iVar4;
  char8_t *pcVar5;
  char8_t *extraout_RDX;
  char8_t *pcVar6;
  char8_t *pcVar7;
  char8_t *pcVar8;
  jessilib *this;
  char8_t *pcVar9;
  char8_t *pcVar10;
  bool bVar11;
  decode_result dVar12;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  
  pcVar8 = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  pcVar7 = (char8_t *)in_prefix._M_len;
  if (pcVar7 == (char8_t *)0x0 || this == (jessilib *)0x0) {
    pcVar10 = (char8_t *)0x0;
  }
  else {
    pcVar10 = (char8_t *)0x0;
    pcVar6 = pcVar7;
    pcVar9 = (char8_t *)0x0;
    do {
      in_string_00._M_str = pcVar6;
      in_string_00._M_len = (size_t)pcVar8;
      dVar12 = decode_codepoint_utf8<char8_t>(this,in_string_00);
      pcVar5 = (char8_t *)dVar12.units;
      if (pcVar5 == (char8_t *)0x0) {
        return (size_t)(char8_t *)0x0;
      }
      wVar2 = in_prefix._M_str[(long)pcVar9];
      pcVar6 = pcVar5;
      if (dVar12.codepoint != wVar2) {
        iVar3 = jessilib::fold(dVar12.codepoint);
        iVar4 = jessilib::fold(wVar2);
        pcVar6 = extraout_RDX;
        if (iVar3 != iVar4) {
          return (size_t)(char8_t *)0x0;
        }
      }
      pcVar10 = pcVar10 + (long)pcVar5;
      pcVar1 = pcVar9 + 1;
      this = this + -(long)pcVar5;
    } while ((this != (jessilib *)0x0) &&
            (pcVar8 = pcVar8 + (long)pcVar5, bVar11 = pcVar7 + -1 != pcVar9, pcVar9 = pcVar1, bVar11
            ));
    pcVar7 = pcVar7 + -(long)pcVar1;
  }
  pcVar8 = (char8_t *)0x0;
  if (pcVar7 == (char8_t *)0x0) {
    pcVar8 = pcVar10;
  }
  return (size_t)pcVar8;
}

Assistant:

size_t starts_with_lengthi(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, skip decoding each point
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (!equalsi(string_front.codepoint, prefix_front.codepoint)) {
			// Codepoints don't fold to same value
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}